

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tostring.cc
# Opt level: O2

int __thiscall
re2::ToStringWalker::PostVisit
          (ToStringWalker *this,Regexp *re,int parent_arg,int pre_arg,int *child_args,
          int nchild_args)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Rune r;
  uint uVar5;
  Rune *pRVar6;
  CharClass *pCVar7;
  CharClass *pCVar8;
  ostream *poVar9;
  string *psVar10;
  int i;
  long lVar11;
  Rune *pRVar12;
  LogMessageFatal local_1b0;
  
  switch(re->op_) {
  case '\x01':
    psVar10 = this->t_;
    break;
  case '\x02':
    if (3 < parent_arg) {
      return 0;
    }
    psVar10 = this->t_;
    break;
  case '\x03':
    psVar10 = this->t_;
    r = Regexp::rune(re);
    AppendLiteral(psVar10,r,(bool)((byte)re->parse_flags_ & 1));
    goto switchD_00132649_default;
  case '\x04':
    for (lVar11 = 0; iVar2 = Regexp::nrunes(re), lVar11 < iVar2; lVar11 = lVar11 + 1) {
      psVar10 = this->t_;
      pRVar6 = Regexp::runes(re);
      AppendLiteral(psVar10,pRVar6[lVar11],(bool)((byte)re->parse_flags_ & 1));
    }
    if (1 < parent_arg) goto switchD_00132649_default;
    goto LAB_001329ff;
  case '\x05':
    if (parent_arg < 2) goto LAB_001329ff;
    goto switchD_00132649_default;
  case '\x06':
    psVar10 = this->t_;
    if ((psVar10->_M_dataplus)._M_p[psVar10->_M_string_length - 1] == '|') {
      std::__cxx11::string::erase((ulong)psVar10,psVar10->_M_string_length - 1);
    }
    else {
      LogMessageFatal::LogMessageFatal
                (&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/tostring.cc",
                 0xb6);
      poVar9 = std::operator<<((ostream *)&local_1b0.super_LogMessage.str_,"Bad final char: ");
      std::ostream::_M_insert<void_const*>(poVar9);
      LogMessageFatal::~LogMessageFatal(&local_1b0);
    }
    if (parent_arg < 3) goto LAB_001329ff;
    goto switchD_00132649_default;
  case '\a':
    psVar10 = this->t_;
    goto LAB_00132851;
  case '\b':
    psVar10 = this->t_;
    goto LAB_00132851;
  case '\t':
    psVar10 = this->t_;
LAB_00132851:
    std::__cxx11::string::append((char *)psVar10);
LAB_001329e4:
    if ((re->parse_flags_ & 0x40) != 0) {
      std::__cxx11::string::append((char *)this->t_);
    }
    if (0 < parent_arg) goto switchD_00132649_default;
LAB_001329ff:
    psVar10 = this->t_;
    goto LAB_00132a0a;
  case '\n':
    iVar2 = Regexp::max(re);
    if (iVar2 == -1) {
      psVar10 = this->t_;
      uVar4 = Regexp::min(re);
      StringPrintf_abi_cxx11_((string *)&local_1b0,"{%d,}",(ulong)uVar4);
      std::__cxx11::string::append((string *)psVar10);
    }
    else {
      iVar2 = Regexp::min(re);
      iVar3 = Regexp::max(re);
      psVar10 = this->t_;
      if (iVar2 == iVar3) {
        uVar4 = Regexp::min(re);
        StringPrintf_abi_cxx11_((string *)&local_1b0,"{%d}",(ulong)uVar4);
        std::__cxx11::string::append((string *)psVar10);
      }
      else {
        uVar4 = Regexp::min(re);
        uVar5 = Regexp::max(re);
        StringPrintf_abi_cxx11_((string *)&local_1b0,"{%d,%d}",(ulong)uVar4,(ulong)uVar5);
        std::__cxx11::string::append((string *)psVar10);
      }
    }
    std::__cxx11::string::~string((string *)&local_1b0);
    goto LAB_001329e4;
  case '\v':
    psVar10 = this->t_;
    break;
  case '\f':
    psVar10 = this->t_;
    break;
  case '\r':
    psVar10 = this->t_;
    break;
  case '\x0e':
    psVar10 = this->t_;
    break;
  case '\x0f':
    psVar10 = this->t_;
    break;
  case '\x10':
    psVar10 = this->t_;
    break;
  case '\x11':
    psVar10 = this->t_;
    break;
  case '\x12':
    psVar10 = this->t_;
    break;
  case '\x13':
    psVar10 = this->t_;
    break;
  case '\x14':
    pCVar7 = Regexp::cc(re);
    psVar10 = this->t_;
    if (*(int *)(pCVar7 + 4) != 0) {
      std::__cxx11::string::append((char *)psVar10);
      pCVar7 = Regexp::cc(re);
      bVar1 = CharClass::Contains(pCVar7,0xfffe);
      if (bVar1) {
        pCVar7 = CharClass::Negate(pCVar7);
        std::__cxx11::string::append((char *)this->t_);
      }
      pRVar6 = *(Rune **)(pCVar7 + 8);
      for (pRVar12 = pRVar6; pRVar12 != pRVar6 + (long)*(int *)(pCVar7 + 0x10) * 2;
          pRVar12 = pRVar12 + 2) {
        AppendCCRange(this->t_,*pRVar12,pRVar12[1]);
        pRVar6 = *(Rune **)(pCVar7 + 8);
      }
      pCVar8 = Regexp::cc(re);
      if (pCVar7 != pCVar8) {
        CharClass::Delete(pCVar7);
      }
      psVar10 = this->t_;
    }
    break;
  case '\x15':
    psVar10 = this->t_;
    Regexp::match_id(re);
    std::__cxx11::string::append((char *)psVar10,0x135b71);
  default:
    goto switchD_00132649_default;
  }
  std::__cxx11::string::append((char *)psVar10);
switchD_00132649_default:
  if (parent_arg == 3) {
    psVar10 = this->t_;
LAB_00132a0a:
    std::__cxx11::string::append((char *)psVar10);
  }
  return 0;
}

Assistant:

int ToStringWalker::PostVisit(Regexp* re, int parent_arg, int pre_arg,
                              int* child_args, int nchild_args) {
  int prec = parent_arg;
  switch (re->op()) {
    case kRegexpNoMatch:
      // There's no simple symbol for "no match", but
      // [^0-Runemax] excludes everything.
      t_->append("[^\\x00-\\x{10ffff}]");
      break;

    case kRegexpEmptyMatch:
      // Append (?:) to make empty string visible,
      // unless this is already being parenthesized.
      if (prec < PrecEmpty)
        t_->append("(?:)");
      break;

    case kRegexpLiteral:
      AppendLiteral(t_, re->rune(),
                    (re->parse_flags() & Regexp::FoldCase) != 0);
      break;

    case kRegexpLiteralString:
      for (int i = 0; i < re->nrunes(); i++)
        AppendLiteral(t_, re->runes()[i],
                      (re->parse_flags() & Regexp::FoldCase) != 0);
      if (prec < PrecConcat)
        t_->append(")");
      break;

    case kRegexpConcat:
      if (prec < PrecConcat)
        t_->append(")");
      break;

    case kRegexpAlternate:
      // Clumsy but workable: the children all appended |
      // at the end of their strings, so just remove the last one.
      if ((*t_)[t_->size()-1] == '|')
        t_->erase(t_->size()-1);
      else
        LOG(DFATAL) << "Bad final char: " << t_;
      if (prec < PrecAlternate)
        t_->append(")");
      break;

    case kRegexpStar:
      t_->append("*");
      if (re->parse_flags() & Regexp::NonGreedy)
        t_->append("?");
      if (prec < PrecUnary)
        t_->append(")");
      break;

    case kRegexpPlus:
      t_->append("+");
      if (re->parse_flags() & Regexp::NonGreedy)
        t_->append("?");
      if (prec < PrecUnary)
        t_->append(")");
      break;

    case kRegexpQuest:
      t_->append("?");
      if (re->parse_flags() & Regexp::NonGreedy)
        t_->append("?");
      if (prec < PrecUnary)
        t_->append(")");
      break;

    case kRegexpRepeat:
      if (re->max() == -1)
        t_->append(StringPrintf("{%d,}", re->min()));
      else if (re->min() == re->max())
        t_->append(StringPrintf("{%d}", re->min()));
      else
        t_->append(StringPrintf("{%d,%d}", re->min(), re->max()));
      if (re->parse_flags() & Regexp::NonGreedy)
        t_->append("?");
      if (prec < PrecUnary)
        t_->append(")");
      break;

    case kRegexpAnyChar:
      t_->append(".");
      break;

    case kRegexpAnyByte:
      t_->append("\\C");
      break;

    case kRegexpBeginLine:
      t_->append("^");
      break;

    case kRegexpEndLine:
      t_->append("$");
      break;

    case kRegexpBeginText:
      t_->append("(?-m:^)");
      break;

    case kRegexpEndText:
      if (re->parse_flags() & Regexp::WasDollar)
        t_->append("(?-m:$)");
      else
        t_->append("\\z");
      break;

    case kRegexpWordBoundary:
      t_->append("\\b");
      break;

    case kRegexpNoWordBoundary:
      t_->append("\\B");
      break;

    case kRegexpCharClass: {
      if (re->cc()->size() == 0) {
        t_->append("[^\\x00-\\x{10ffff}]");
        break;
      }
      t_->append("[");
      // Heuristic: show class as negated if it contains the
      // non-character 0xFFFE.
      CharClass* cc = re->cc();
      if (cc->Contains(0xFFFE)) {
        cc = cc->Negate();
        t_->append("^");
      }
      for (CharClass::iterator i = cc->begin(); i != cc->end(); ++i)
        AppendCCRange(t_, i->lo, i->hi);
      if (cc != re->cc())
        cc->Delete();
      t_->append("]");
      break;
    }

    case kRegexpCapture:
      t_->append(")");
      break;

    case kRegexpHaveMatch:
      // There's no syntax accepted by the parser to generate
      // this node (it is generated by RE2::Set) so make something
      // up that is readable but won't compile.
      t_->append("(?HaveMatch:%d)", re->match_id());
      break;
  }

  // If the parent is an alternation, append the | for it.
  if (prec == PrecAlternate)
    t_->append("|");

  return 0;
}